

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headergen.c
# Opt level: O3

void seekcol(FILE *f,int src,int dst)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  
  uVar2 = dst - src;
  if (uVar2 != 0 && src <= dst) {
    iVar3 = dst + 7;
    if (-1 < dst) {
      iVar3 = dst;
    }
    iVar1 = src + 7;
    if (-1 < src) {
      iVar1 = src;
    }
    iVar3 = (iVar3 >> 3) - (iVar1 >> 3);
    if (iVar3 != 0) {
      do {
        fputc(9,(FILE *)f);
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
      uVar2 = dst & 7;
    }
    for (; uVar2 != 0; uVar2 = uVar2 - 1) {
      fputc(0x20,(FILE *)f);
    }
    return;
  }
  fputc(9,(FILE *)f);
  return;
}

Assistant:

void seekcol (FILE *f, int src, int dst) {
	if (dst <= src)
		fprintf (f, "\t");
	else {
		int n = dst/8 - src/8;
		if (n) {
			while (n--)
				fprintf (f, "\t");
			n = dst&7;
		} else
			n = dst-src;
		while (n--)
			fprintf (f, " ");
	}
}